

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_date_tests.cpp
# Opt level: O0

void __thiscall DateTests_canCreateDates_Test::TestBody(DateTests_canCreateDates_Test *this)

{
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  char *pcVar4;
  char *in_R9;
  string local_be0;
  AssertHelper local_bc0;
  Message local_bb8;
  bool local_ba9;
  undefined1 local_ba8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_b78;
  Message local_b70;
  ComparableString local_b68;
  ComparableString local_b48;
  bool local_b21;
  undefined1 local_b20 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_af0;
  Message local_ae8;
  bool local_ad9;
  undefined1 local_ad8 [8];
  AssertionResult gtest_ar__6;
  int32_t local_ac0;
  int32_t local_abc;
  undefined1 local_ab8 [8];
  Date date12;
  string local_a68;
  ComparableString local_a48;
  undefined1 local_a28 [8];
  Date date11;
  AssertHelper local_9c0;
  Message local_9b8;
  bool local_9a9;
  undefined1 local_9a8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_978;
  Message local_970;
  ComparableString local_968;
  ComparableString local_948;
  bool local_921;
  undefined1 local_920 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_8f0;
  Message local_8e8;
  bool local_8d9;
  undefined1 local_8d8 [8];
  AssertionResult gtest_ar__3;
  int32_t local_8c0;
  int32_t local_8bc;
  undefined1 local_8b8 [8];
  Date date10;
  string local_868;
  ComparableString local_848;
  undefined1 local_828 [8];
  Date date9;
  AssertHelper local_7c0;
  Message local_7b8;
  bool local_7a9;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_778;
  Message local_770;
  ComparableString local_768;
  ComparableString local_748;
  bool local_721;
  undefined1 local_720 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_6f0;
  Message local_6e8;
  bool local_6d9;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_;
  int32_t local_6c0;
  int32_t local_6bc;
  undefined1 local_6b8 [8];
  Date date8;
  string local_668;
  ComparableString local_648;
  undefined1 local_628 [8];
  Date date7;
  Message local_5d8;
  int local_5d0;
  int32_t local_5cc;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar_23;
  Message local_5b0;
  int local_5a8;
  int32_t local_5a4;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_22;
  Message local_588;
  int local_580;
  int32_t local_57c;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_21;
  Message local_560;
  int local_558;
  int32_t local_554;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_20;
  undefined1 local_538 [8];
  Date date6;
  Message local_4e8;
  int local_4e0;
  int32_t local_4dc;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_19;
  Message local_4c0;
  int local_4b8;
  int32_t local_4b4;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_18;
  Message local_498;
  int local_490;
  int32_t local_48c;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_17;
  Message local_470;
  int local_468;
  int32_t local_464;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_16;
  int32_t local_448;
  int32_t local_444;
  undefined1 local_440 [8];
  Date date5;
  Message local_3f0;
  int local_3e8;
  int32_t local_3e4;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_15;
  Message local_3c8;
  int local_3c0;
  int32_t local_3bc;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_14;
  Message local_3a0;
  int local_398;
  int32_t local_394;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_13;
  Message local_378;
  int local_370;
  int32_t local_36c;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_12;
  undefined1 local_350 [8];
  Date date4;
  Message local_300;
  int local_2f8;
  int32_t local_2f4;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_11;
  Message local_2d8;
  int local_2d0;
  int32_t local_2cc;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_10;
  Message local_2b0;
  int local_2a8;
  int32_t local_2a4;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_9;
  Message local_288;
  int local_280;
  int32_t local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_8;
  int32_t local_260;
  int32_t local_25c;
  undefined1 local_258 [8];
  Date date3;
  Message local_208;
  int local_200;
  int32_t local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_7;
  Message local_1e0;
  int local_1d8;
  int32_t local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_6;
  Message local_1b8;
  int local_1b0;
  int32_t local_1ac;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_5;
  Message local_190;
  int local_188;
  int32_t local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_4;
  undefined1 local_168 [8];
  Date date2;
  Message local_118;
  int local_110;
  int32_t local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_3;
  Message local_f0;
  int local_e8;
  int32_t local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  int local_c0;
  int32_t local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_a0;
  Message local_98;
  int local_90 [5];
  int32_t local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  int32_t local_60;
  int32_t local_5c;
  undefined1 local_58 [8];
  Date date1;
  DateTests_canCreateDates_Test *this_local;
  
  local_5c = 0x7e1;
  local_60 = 4;
  gtest_ar.message_.ptr_._4_4_ = 0xc;
  date1.m_days_of_months._M_h._M_single_bucket = (__node_base_ptr)this;
  database::Date::With_yyyy_mm_dd
            ((Date *)local_58,&stack0xffffffffffffffa4,&stack0xffffffffffffffa0,
             (int32_t *)((long)&gtest_ar.message_.ptr_ + 4));
  local_7c = database::Date::day((Date *)local_58);
  local_90[0] = 0xc;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_78,"date1.day()","12",&local_7c,local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
               ,8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_bc = database::Date::month((Date *)local_58);
    local_c0 = 4;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_b8,"date1.month()","04",&local_bc,&local_c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                 ,9,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_c8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_e4 = database::Date::year((Date *)local_58);
      local_e8 = 0x7e1;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_e0,"date1.year()","2017",&local_e4,&local_e8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
      if (!bVar1) {
        testing::Message::Message(&local_f0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                   ,10,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_f0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_10c = database::Date::serialized_value((Date *)local_58);
        local_110 = 0x133c6ac;
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_108,"date1.serialized_value()","20170412",&local_10c,
                   &local_110);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
        if (!bVar1) {
          testing::Message::Message(&local_118);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&date2.m_days_of_months._M_h._M_single_bucket,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                     ,0xb,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&date2.m_days_of_months._M_h._M_single_bucket,&local_118);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)&date2.m_days_of_months._M_h._M_single_bucket);
          testing::Message::~Message(&local_118);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          gtest_ar_4.message_.ptr_._4_4_ = 0x131a6e2;
          database::Date::With_yyyymmdd
                    ((Date *)local_168,(int32_t *)((long)&gtest_ar_4.message_.ptr_ + 4));
          local_184 = database::Date::day((Date *)local_168);
          local_188 = 2;
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((EqHelper<false> *)local_180,"date2.day()","02",&local_184,&local_188);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
          if (!bVar1) {
            testing::Message::Message(&local_190);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                       ,0xe,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_190);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_190);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            local_1ac = database::Date::month((Date *)local_168);
            local_1b0 = 0xc;
            testing::internal::EqHelper<false>::Compare<int,int>
                      ((EqHelper<false> *)local_1a8,"date2.month()","12",&local_1ac,&local_1b0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
            if (!bVar1) {
              testing::Message::Message(&local_1b8);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                         ,0xf,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_1b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_1b8);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
              local_1d4 = database::Date::year((Date *)local_168);
              local_1d8 = 0x7d3;
              testing::internal::EqHelper<false>::Compare<int,int>
                        ((EqHelper<false> *)local_1d0,"date2.year()","2003",&local_1d4,&local_1d8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
              if (!bVar1) {
                testing::Message::Message(&local_1e0);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                           ,0x10,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_1e0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_1e0);
              }
              gtest_ar_1.message_.ptr_._5_3_ = 0;
              gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
              if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                local_1fc = database::Date::serialized_value((Date *)local_168);
                local_200 = 0x131a6e2;
                testing::internal::EqHelper<false>::Compare<int,int>
                          ((EqHelper<false> *)local_1f8,"date2.serialized_value()","20031202",
                           &local_1fc,&local_200);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1f8);
                if (!bVar1) {
                  testing::Message::Message(&local_208);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&date3.m_days_of_months._M_h._M_single_bucket,
                             kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                             ,0x11,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&date3.m_days_of_months._M_h._M_single_bucket,
                             &local_208);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&date3.m_days_of_months._M_h._M_single_bucket);
                  testing::Message::~Message(&local_208);
                }
                gtest_ar_1.message_.ptr_._5_3_ = 0;
                gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
                if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                  local_25c = 10;
                  local_260 = 5;
                  gtest_ar_8.message_.ptr_._4_4_ = 0x7ce;
                  database::Date::With_mm_dd_yyyy
                            ((Date *)local_258,&stack0xfffffffffffffda4,&stack0xfffffffffffffda0,
                             (int32_t *)((long)&gtest_ar_8.message_.ptr_ + 4));
                  local_27c = database::Date::day((Date *)local_258);
                  local_280 = 5;
                  testing::internal::EqHelper<false>::Compare<int,int>
                            ((EqHelper<false> *)local_278,"date3.day()","05",&local_27c,&local_280);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_278);
                  if (!bVar1) {
                    testing::Message::Message(&local_288);
                    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_278)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                               ,0x14,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,&local_288);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(&local_288);
                  }
                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                    local_2a4 = database::Date::month((Date *)local_258);
                    local_2a8 = 10;
                    testing::internal::EqHelper<false>::Compare<int,int>
                              ((EqHelper<false> *)local_2a0,"date3.month()","10",&local_2a4,
                               &local_2a8);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2a0);
                    if (!bVar1) {
                      testing::Message::Message(&local_2b0);
                      pcVar4 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_2a0);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                 ,0x15,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_10.message_,&local_2b0);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_);
                      testing::Message::~Message(&local_2b0);
                    }
                    gtest_ar_1.message_.ptr_._5_3_ = 0;
                    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
                    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                      local_2cc = database::Date::year((Date *)local_258);
                      local_2d0 = 0x7ce;
                      testing::internal::EqHelper<false>::Compare<int,int>
                                ((EqHelper<false> *)local_2c8,"date3.year()","1998",&local_2cc,
                                 &local_2d0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_2c8);
                      if (!bVar1) {
                        testing::Message::Message(&local_2d8);
                        pcVar4 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_2c8);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                   ,0x16,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_11.message_,&local_2d8);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_);
                        testing::Message::~Message(&local_2d8);
                      }
                      gtest_ar_1.message_.ptr_._5_3_ = 0;
                      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
                      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                        local_2f4 = database::Date::serialized_value((Date *)local_258);
                        local_2f8 = 0x130e2cd;
                        testing::internal::EqHelper<false>::Compare<int,int>
                                  ((EqHelper<false> *)local_2f0,"date3.serialized_value()",
                                   "19981005",&local_2f4,&local_2f8);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_2f0);
                        if (!bVar1) {
                          testing::Message::Message(&local_300);
                          pcVar4 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_2f0);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&date4.m_days_of_months._M_h._M_single_bucket,
                                     kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                     ,0x17,pcVar4);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&date4.m_days_of_months._M_h._M_single_bucket,
                                     &local_300);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&date4.m_days_of_months._M_h._M_single_bucket);
                          testing::Message::~Message(&local_300);
                        }
                        gtest_ar_1.message_.ptr_._5_3_ = 0;
                        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
                        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                          gtest_ar_12.message_.ptr_._4_4_ = 0x6f1d42;
                          database::Date::With_mmddyyyy
                                    ((Date *)local_350,
                                     (int32_t *)((long)&gtest_ar_12.message_.ptr_ + 4));
                          local_36c = database::Date::day((Date *)local_350);
                          local_370 = 0x1c;
                          testing::internal::EqHelper<false>::Compare<int,int>
                                    ((EqHelper<false> *)local_368,"date4.day()","28",&local_36c,
                                     &local_370);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_368);
                          if (!bVar1) {
                            testing::Message::Message(&local_378);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_368);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                       ,0x1a,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_13.message_,&local_378);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_);
                            testing::Message::~Message(&local_378);
                          }
                          gtest_ar_1.message_.ptr_._5_3_ = 0;
                          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
                          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                            local_394 = database::Date::month((Date *)local_350);
                            local_398 = 7;
                            testing::internal::EqHelper<false>::Compare<int,int>
                                      ((EqHelper<false> *)local_390,"date4.month()","7",&local_394,
                                       &local_398);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_390);
                            if (!bVar1) {
                              testing::Message::Message(&local_3a0);
                              pcVar4 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_390);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                         ,0x1b,pcVar4);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_14.message_,&local_3a0);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_);
                              testing::Message::~Message(&local_3a0);
                            }
                            gtest_ar_1.message_.ptr_._5_3_ = 0;
                            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_390)
                            ;
                            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                              local_3bc = database::Date::year((Date *)local_350);
                              local_3c0 = 0x7c2;
                              testing::internal::EqHelper<false>::Compare<int,int>
                                        ((EqHelper<false> *)local_3b8,"date4.year()","1986",
                                         &local_3bc,&local_3c0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_3b8);
                              if (!bVar1) {
                                testing::Message::Message(&local_3c8);
                                pcVar4 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_3b8);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                           ,0x1c,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_15.message_,&local_3c8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_);
                                testing::Message::~Message(&local_3c8);
                              }
                              gtest_ar_1.message_.ptr_._5_3_ = 0;
                              gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_3b8);
                              if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                local_3e4 = database::Date::serialized_value((Date *)local_350);
                                local_3e8 = 0x12f0cf8;
                                testing::internal::EqHelper<false>::Compare<int,int>
                                          ((EqHelper<false> *)local_3e0,"date4.serialized_value()",
                                           "19860728",&local_3e4,&local_3e8);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_3e0);
                                if (!bVar1) {
                                  testing::Message::Message(&local_3f0);
                                  pcVar4 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_3e0);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)
                                             &date5.m_days_of_months._M_h._M_single_bucket,
                                             kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                             ,0x1d,pcVar4);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)
                                             &date5.m_days_of_months._M_h._M_single_bucket,
                                             &local_3f0);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)
                                             &date5.m_days_of_months._M_h._M_single_bucket);
                                  testing::Message::~Message(&local_3f0);
                                }
                                gtest_ar_1.message_.ptr_._5_3_ = 0;
                                gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_3e0);
                                if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                  local_444 = 1;
                                  local_448 = 0xb;
                                  gtest_ar_16.message_.ptr_._4_4_ = 0x7d1;
                                  database::Date::With_dd_mm_yyyy
                                            ((Date *)local_440,&stack0xfffffffffffffbbc,
                                             &stack0xfffffffffffffbb8,
                                             (int32_t *)((long)&gtest_ar_16.message_.ptr_ + 4));
                                  local_464 = database::Date::day((Date *)local_440);
                                  local_468 = 1;
                                  testing::internal::EqHelper<false>::Compare<int,int>
                                            ((EqHelper<false> *)local_460,"date5.day()","1",
                                             &local_464,&local_468);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_460);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_470);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_460);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_17.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                               ,0x20,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_17.message_,&local_470);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_17.message_);
                                    testing::Message::~Message(&local_470);
                                  }
                                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_460);
                                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                    local_48c = database::Date::month((Date *)local_440);
                                    local_490 = 0xb;
                                    testing::internal::EqHelper<false>::Compare<int,int>
                                              ((EqHelper<false> *)local_488,"date5.month()","11",
                                               &local_48c,&local_490);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_488);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_498);
                                      pcVar4 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_488);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_18.message_,kFatalFailure
                                                 ,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                 ,0x21,pcVar4);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_18.message_,&local_498);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_18.message_);
                                      testing::Message::~Message(&local_498);
                                    }
                                    gtest_ar_1.message_.ptr_._5_3_ = 0;
                                    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_488);
                                    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                      local_4b4 = database::Date::year((Date *)local_440);
                                      local_4b8 = 0x7d1;
                                      testing::internal::EqHelper<false>::Compare<int,int>
                                                ((EqHelper<false> *)local_4b0,"date5.year()","2001",
                                                 &local_4b4,&local_4b8);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_4b0);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_4c0);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_4b0);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_19.message_,
                                                   kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x22,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_19.message_,&local_4c0)
                                        ;
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_19.message_);
                                        testing::Message::~Message(&local_4c0);
                                      }
                                      gtest_ar_1.message_.ptr_._5_3_ = 0;
                                      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_4b0);
                                      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                        local_4dc = database::Date::serialized_value
                                                              ((Date *)local_440);
                                        local_4e0 = 0x131585d;
                                        testing::internal::EqHelper<false>::Compare<int,int>
                                                  ((EqHelper<false> *)local_4d8,
                                                   "date5.serialized_value()","20011101",&local_4dc,
                                                   &local_4e0);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_4d8);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_4e8);
                                          pcVar4 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_4d8);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)
                                                     &date6.m_days_of_months._M_h._M_single_bucket,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x23,pcVar4);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)
                                                     &date6.m_days_of_months._M_h._M_single_bucket,
                                                     &local_4e8);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)
                                                     &date6.m_days_of_months._M_h._M_single_bucket);
                                          testing::Message::~Message(&local_4e8);
                                        }
                                        gtest_ar_1.message_.ptr_._5_3_ = 0;
                                        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_4d8);
                                        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                          gtest_ar_20.message_.ptr_._4_4_ = 0x12240be;
                                          database::Date::With_ddmmyyyy
                                                    ((Date *)local_538,
                                                     (int32_t *)
                                                     ((long)&gtest_ar_20.message_.ptr_ + 4));
                                          local_554 = database::Date::day((Date *)local_538);
                                          local_558 = 0x13;
                                          testing::internal::EqHelper<false>::Compare<int,int>
                                                    ((EqHelper<false> *)local_550,"date6.day()","19"
                                                     ,&local_554,&local_558);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_550);
                                          if (!bVar1) {
                                            testing::Message::Message(&local_560);
                                            pcVar4 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_550);
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&gtest_ar_21.message_,
                                                       kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x26,pcVar4);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&gtest_ar_21.message_,
                                                       &local_560);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      ((AssertHelper *)&gtest_ar_21.message_);
                                            testing::Message::~Message(&local_560);
                                          }
                                          gtest_ar_1.message_.ptr_._5_3_ = 0;
                                          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_550);
                                          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                            local_57c = database::Date::month((Date *)local_538);
                                            local_580 = 2;
                                            testing::internal::EqHelper<false>::Compare<int,int>
                                                      ((EqHelper<false> *)local_578,"date6.month()",
                                                       "02",&local_57c,&local_580);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_578);
                                            if (!bVar1) {
                                              testing::Message::Message(&local_588);
                                              pcVar4 = testing::AssertionResult::failure_message
                                                                 ((AssertionResult *)local_578);
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&gtest_ar_22.message_,
                                                         kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x27,pcVar4);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&gtest_ar_22.message_,
                                                         &local_588);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        ((AssertHelper *)&gtest_ar_22.message_);
                                              testing::Message::~Message(&local_588);
                                            }
                                            gtest_ar_1.message_.ptr_._5_3_ = 0;
                                            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_578);
                                            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                              local_5a4 = database::Date::year((Date *)local_538);
                                              local_5a8 = 0x7de;
                                              testing::internal::EqHelper<false>::Compare<int,int>
                                                        ((EqHelper<false> *)local_5a0,"date6.year()"
                                                         ,"2014",&local_5a4,&local_5a8);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_5a0);
                                              if (!bVar1) {
                                                testing::Message::Message(&local_5b0);
                                                pcVar4 = testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)local_5a0);
                                                testing::internal::AssertHelper::AssertHelper
                                                          ((AssertHelper *)&gtest_ar_23.message_,
                                                           kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x28,pcVar4);
                                                testing::internal::AssertHelper::operator=
                                                          ((AssertHelper *)&gtest_ar_23.message_,
                                                           &local_5b0);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          ((AssertHelper *)&gtest_ar_23.message_);
                                                testing::Message::~Message(&local_5b0);
                                              }
                                              gtest_ar_1.message_.ptr_._5_3_ = 0;
                                              gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_5a0);
                                              if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                                local_5cc = database::Date::serialized_value
                                                                      ((Date *)local_538);
                                                local_5d0 = 0x13350bb;
                                                testing::internal::EqHelper<false>::Compare<int,int>
                                                          ((EqHelper<false> *)local_5c8,
                                                           "date6.serialized_value()","20140219",
                                                           &local_5cc,&local_5d0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_5c8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_5d8);
                                                  pcVar4 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_5c8);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)
                                                             &date7.m_days_of_months._M_h.
                                                              _M_single_bucket,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x29,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)
                                                             &date7.m_days_of_months._M_h.
                                                              _M_single_bucket,&local_5d8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)
                                                             &date7.m_days_of_months._M_h.
                                                              _M_single_bucket);
                                                  testing::Message::~Message(&local_5d8);
                                                }
                                                gtest_ar_1.message_.ptr_._5_3_ = 0;
                                                gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_5c8);
                                                if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_668,"20031202",
                                                             (allocator<char> *)
                                                             ((long)&date8.m_days_of_months._M_h.
                                                                     _M_single_bucket + 7));
                                                  database::ComparableString::ComparableString
                                                            (&local_648,&local_668);
                                                  database::Date::With_yyyymmdd
                                                            ((Date *)local_628,&local_648);
                                                  database::ComparableString::~ComparableString
                                                            (&local_648);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_668);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             ((long)&date8.m_days_of_months._M_h.
                                                                     _M_single_bucket + 7));
                                                  local_6bc = 0x7d3;
                                                  local_6c0 = 0xc;
                                                  gtest_ar_.message_.ptr_._4_4_ = 2;
                                                  database::Date::With_yyyy_mm_dd
                                                            ((Date *)local_6b8,
                                                             &stack0xfffffffffffff944,
                                                             &stack0xfffffffffffff940,
                                                             (int32_t *)
                                                             ((long)&gtest_ar_.message_.ptr_ + 4));
                                                  local_6d9 = database::Date::operator==
                                                                        ((Date *)local_628,
                                                                         (Date *)local_6b8);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_6d8,&local_6d9
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_6d8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_6e8);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__1.message_,
                                                               (internal *)local_6d8,
                                                               (AssertionResult *)"date7 == date8",
                                                               "false","true",in_R9);
                                                    pcVar4 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_6f0,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x2d,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_6f0,&local_6e8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_6f0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__1.message_);
                                                  testing::Message::~Message(&local_6e8);
                                                  }
                                                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6d8);
                                                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                                    database::Date::string_value
                                                              (&local_748,(Date *)local_628);
                                                    database::Date::string_value
                                                              (&local_768,(Date *)local_6b8);
                                                    local_721 = database::ComparableString::
                                                                operator==(&local_748,&local_768);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_720,
                                                               &local_721,(type *)0x0);
                                                    database::ComparableString::~ComparableString
                                                              (&local_768);
                                                    database::ComparableString::~ComparableString
                                                              (&local_748);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_720)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_770);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__2.message_,
                                                                 (internal *)local_720,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "date7.string_value() == date8.string_value()",
                                                  "false","true",in_R9);
                                                  pcVar4 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_778,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x2e,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_778,&local_770);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_778);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__2.message_);
                                                  testing::Message::~Message(&local_770);
                                                  }
                                                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_720);
                                                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                                    iVar2 = database::Date::serialized_value
                                                                      ((Date *)local_628);
                                                    iVar3 = database::Date::serialized_value
                                                                      ((Date *)local_6b8);
                                                    local_7a9 = iVar2 == iVar3;
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_7a8,
                                                               &local_7a9,(type *)0x0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_7a8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_7b8);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)
                                                                 &date9.m_days_of_months._M_h.
                                                                  _M_single_bucket,
                                                                 (internal *)local_7a8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "date7.serialized_value() == date8.serialized_value()"
                                                  ,"false","true",in_R9);
                                                  pcVar4 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_7c0,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x2f,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_7c0,&local_7b8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_7c0);
                                                  std::__cxx11::string::~string
                                                            ((string *)
                                                             &date9.m_days_of_months._M_h.
                                                              _M_single_bucket);
                                                  testing::Message::~Message(&local_7b8);
                                                  }
                                                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7a8);
                                                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_868,"7281986",
                                                               (allocator<char> *)
                                                               ((long)&date10.m_days_of_months._M_h.
                                                                       _M_single_bucket + 7));
                                                    database::ComparableString::ComparableString
                                                              (&local_848,&local_868);
                                                    database::Date::With_mmddyyyy
                                                              ((Date *)local_828,&local_848);
                                                    database::ComparableString::~ComparableString
                                                              (&local_848);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_868);
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)
                                                               ((long)&date10.m_days_of_months._M_h.
                                                                       _M_single_bucket + 7));
                                                    local_8bc = 7;
                                                    local_8c0 = 0x1c;
                                                    gtest_ar__3.message_.ptr_._4_4_ = 0x7c2;
                                                    database::Date::With_mm_dd_yyyy
                                                              ((Date *)local_8b8,
                                                               &stack0xfffffffffffff744,
                                                               &stack0xfffffffffffff740,
                                                               (int32_t *)
                                                               ((long)&gtest_ar__3.message_.ptr_ + 4
                                                               ));
                                                    local_8d9 = database::Date::operator==
                                                                          ((Date *)local_828,
                                                                           (Date *)local_8b8);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_8d8,
                                                               &local_8d9,(type *)0x0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_8d8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_8e8);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__4.message_,
                                                                 (internal *)local_8d8,
                                                                 (AssertionResult *)
                                                                 "date9 == date10","false","true",
                                                                 in_R9);
                                                      pcVar4 = (char *)std::__cxx11::string::c_str()
                                                      ;
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_8f0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x33,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_8f0,&local_8e8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_8f0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__4.message_);
                                                  testing::Message::~Message(&local_8e8);
                                                  }
                                                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_8d8);
                                                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                                    database::Date::string_value
                                                              (&local_948,(Date *)local_828);
                                                    database::Date::string_value
                                                              (&local_968,(Date *)local_8b8);
                                                    local_921 = database::ComparableString::
                                                                operator==(&local_948,&local_968);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_920,
                                                               &local_921,(type *)0x0);
                                                    database::ComparableString::~ComparableString
                                                              (&local_968);
                                                    database::ComparableString::~ComparableString
                                                              (&local_948);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_920)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_970);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__5.message_,
                                                                 (internal *)local_920,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "date9.string_value() == date10.string_value()",
                                                  "false","true",in_R9);
                                                  pcVar4 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_978,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x34,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_978,&local_970);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_978);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__5.message_);
                                                  testing::Message::~Message(&local_970);
                                                  }
                                                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_920);
                                                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                                    iVar2 = database::Date::serialized_value
                                                                      ((Date *)local_828);
                                                    iVar3 = database::Date::serialized_value
                                                                      ((Date *)local_8b8);
                                                    local_9a9 = iVar2 == iVar3;
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_9a8,
                                                               &local_9a9,(type *)0x0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_9a8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_9b8);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)
                                                                 &date11.m_days_of_months._M_h.
                                                                  _M_single_bucket,
                                                                 (internal *)local_9a8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "date9.serialized_value() == date10.serialized_value()"
                                                  ,"false","true",in_R9);
                                                  pcVar4 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_9c0,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x35,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_9c0,&local_9b8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_9c0);
                                                  std::__cxx11::string::~string
                                                            ((string *)
                                                             &date11.m_days_of_months._M_h.
                                                              _M_single_bucket);
                                                  testing::Message::~Message(&local_9b8);
                                                  }
                                                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_9a8);
                                                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_a68,"19022014",
                                                               (allocator<char> *)
                                                               ((long)&date12.m_days_of_months._M_h.
                                                                       _M_single_bucket + 7));
                                                    database::ComparableString::ComparableString
                                                              (&local_a48,&local_a68);
                                                    database::Date::With_ddmmyyyy
                                                              ((Date *)local_a28,&local_a48);
                                                    database::ComparableString::~ComparableString
                                                              (&local_a48);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_a68);
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)
                                                               ((long)&date12.m_days_of_months._M_h.
                                                                       _M_single_bucket + 7));
                                                    local_abc = 0x13;
                                                    local_ac0 = 2;
                                                    gtest_ar__6.message_.ptr_._4_4_ = 0x7de;
                                                    database::Date::With_dd_mm_yyyy
                                                              ((Date *)local_ab8,
                                                               &stack0xfffffffffffff544,
                                                               &stack0xfffffffffffff540,
                                                               (int32_t *)
                                                               ((long)&gtest_ar__6.message_.ptr_ + 4
                                                               ));
                                                    local_ad9 = database::Date::operator==
                                                                          ((Date *)local_a28,
                                                                           (Date *)local_ab8);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_ad8,
                                                               &local_ad9,(type *)0x0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_ad8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_ae8);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__7.message_,
                                                                 (internal *)local_ad8,
                                                                 (AssertionResult *)
                                                                 "date11 == date12","false","true",
                                                                 in_R9);
                                                      pcVar4 = (char *)std::__cxx11::string::c_str()
                                                      ;
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_af0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x39,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_af0,&local_ae8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_af0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__7.message_);
                                                  testing::Message::~Message(&local_ae8);
                                                  }
                                                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ad8);
                                                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                                    database::Date::string_value
                                                              (&local_b48,(Date *)local_a28);
                                                    database::Date::string_value
                                                              (&local_b68,(Date *)local_ab8);
                                                    local_b21 = database::ComparableString::
                                                                operator==(&local_b48,&local_b68);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_b20,
                                                               &local_b21,(type *)0x0);
                                                    database::ComparableString::~ComparableString
                                                              (&local_b68);
                                                    database::ComparableString::~ComparableString
                                                              (&local_b48);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_b20)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_b70);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__8.message_,
                                                                 (internal *)local_b20,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "date11.string_value() == date12.string_value()",
                                                  "false","true",in_R9);
                                                  pcVar4 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_b78,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x3a,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_b78,&local_b70);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_b78);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__8.message_);
                                                  testing::Message::~Message(&local_b70);
                                                  }
                                                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_b20);
                                                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                                    iVar2 = database::Date::serialized_value
                                                                      ((Date *)local_a28);
                                                    iVar3 = database::Date::serialized_value
                                                                      ((Date *)local_ab8);
                                                    local_ba9 = iVar2 == iVar3;
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_ba8,
                                                               &local_ba9,(type *)0x0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_ba8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_bb8);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                (&local_be0,(internal *)local_ba8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "date11.serialized_value() == date12.serialized_value()"
                                                  ,"false","true",in_R9);
                                                  pcVar4 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_bc0,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x3b,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_bc0,&local_bb8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_bc0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_be0);
                                                  testing::Message::~Message(&local_bb8);
                                                  }
                                                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ba8);
                                                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_1.message_.ptr_._4_4_ = 0;
                                                  }
                                                  }
                                                  }
                                                  database::Date::~Date((Date *)local_ab8);
                                                  database::Date::~Date((Date *)local_a28);
                                                  }
                                                  }
                                                  }
                                                  database::Date::~Date((Date *)local_8b8);
                                                  database::Date::~Date((Date *)local_828);
                                                  }
                                                  }
                                                  }
                                                  database::Date::~Date((Date *)local_6b8);
                                                  database::Date::~Date((Date *)local_628);
                                                }
                                              }
                                            }
                                          }
                                          database::Date::~Date((Date *)local_538);
                                        }
                                      }
                                    }
                                  }
                                  database::Date::~Date((Date *)local_440);
                                }
                              }
                            }
                          }
                          database::Date::~Date((Date *)local_350);
                        }
                      }
                    }
                  }
                  database::Date::~Date((Date *)local_258);
                }
              }
            }
          }
          database::Date::~Date((Date *)local_168);
        }
      }
    }
  }
  database::Date::~Date((Date *)local_58);
  return;
}

Assistant:

TEST(DateTests,canCreateDates)
{
  database::Date date1 = database::Date::With_yyyy_mm_dd(2017,04,12);
  ASSERT_EQ(date1.day(),12);
  ASSERT_EQ(date1.month(),04);
  ASSERT_EQ(date1.year(),2017);
  ASSERT_EQ(date1.serialized_value(),20170412);

  database::Date date2 = database::Date::With_yyyymmdd(20031202);
  ASSERT_EQ(date2.day(),02);
  ASSERT_EQ(date2.month(),12);
  ASSERT_EQ(date2.year(),2003);
  ASSERT_EQ(date2.serialized_value(),20031202);

  database::Date date3 = database::Date::With_mm_dd_yyyy(10,05,1998);
  ASSERT_EQ(date3.day(),05);
  ASSERT_EQ(date3.month(),10);
  ASSERT_EQ(date3.year(),1998);
  ASSERT_EQ(date3.serialized_value(),19981005);

  database::Date date4 = database::Date::With_mmddyyyy(7281986);
  ASSERT_EQ(date4.day(),28);
  ASSERT_EQ(date4.month(),7);
  ASSERT_EQ(date4.year(),1986);
  ASSERT_EQ(date4.serialized_value(),19860728);

  database::Date date5 = database::Date::With_dd_mm_yyyy(1,11,2001);
  ASSERT_EQ(date5.day(),1);
  ASSERT_EQ(date5.month(),11);
  ASSERT_EQ(date5.year(),2001);
  ASSERT_EQ(date5.serialized_value(),20011101);

  database::Date date6 = database::Date::With_ddmmyyyy(19022014);
  ASSERT_EQ(date6.day(),19);
  ASSERT_EQ(date6.month(),02);
  ASSERT_EQ(date6.year(),2014);
  ASSERT_EQ(date6.serialized_value(),20140219);

  database::Date date7 = database::Date::With_yyyymmdd((std::string)"20031202");
  database::Date date8 = database::Date::With_yyyy_mm_dd(2003,12,02);
  ASSERT_TRUE(date7 == date8);
  ASSERT_TRUE(date7.string_value() == date8.string_value());
  ASSERT_TRUE(date7.serialized_value() == date8.serialized_value());

  database::Date date9 = database::Date::With_mmddyyyy((std::string)"7281986");
  database::Date date10 = database::Date::With_mm_dd_yyyy(07,28,1986);
  ASSERT_TRUE(date9 == date10);
  ASSERT_TRUE(date9.string_value() == date10.string_value());
  ASSERT_TRUE(date9.serialized_value() == date10.serialized_value());

  database::Date date11 = database::Date::With_ddmmyyyy((std::string)"19022014");
  database::Date date12 = database::Date::With_dd_mm_yyyy(19,02,2014);
  ASSERT_TRUE(date11 == date12);
  ASSERT_TRUE(date11.string_value() == date12.string_value());
  ASSERT_TRUE(date11.serialized_value() == date12.serialized_value());
}